

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

void __thiscall
capnp::SchemaFile::DiskSchemaFile::reportError
          (DiskSchemaFile *this,SourcePos start,SourcePos end,StringPtr message)

{
  ExceptionCallback *pEVar1;
  size_t sVar2;
  StringPtr value;
  Array<char> AStack_1d8;
  Array<char> local_1c0;
  Exception local_1a8;
  
  sVar2 = end._0_8_;
  pEVar1 = kj::getExceptionCallback();
  kj::Path::toString((String *)&local_1c0,&this->path,false);
  value.content.size_ = sVar2;
  value.content.ptr = (char *)message.content.size_;
  kj::heapString((String *)&AStack_1d8,(kj *)message.content.ptr,value);
  kj::Exception::Exception(&local_1a8,FAILED,(String *)&local_1c0,start.line,(String *)&AStack_1d8);
  (*pEVar1->_vptr_ExceptionCallback[2])(pEVar1,&local_1a8);
  kj::Exception::~Exception(&local_1a8);
  kj::Array<char>::~Array(&AStack_1d8);
  kj::Array<char>::~Array(&local_1c0);
  return;
}

Assistant:

void reportError(SourcePos start, SourcePos end, kj::StringPtr message) const override {
    kj::getExceptionCallback().onRecoverableException(kj::Exception(
        kj::Exception::Type::FAILED, path.toString(), start.line,
        kj::heapString(message)));
  }